

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O2

void __thiscall Mapper004::Mapper004(Mapper004 *this,FileHeader *_header)

{
  byte bVar1;
  uint uVar2;
  Console *this_00;
  PPU *this_01;
  
  (this->super_IMapper)._vptr_IMapper = (_func_int **)&PTR_execute_0011cb60;
  this->irqEnabled = false;
  this->reloadVal = '\0';
  this->counter = '\0';
  this->params = _header;
  this_00 = Console::Instance();
  this_01 = Console::getPPU(this_00);
  PPU::setMirroring(this_01,_header->flagsPPUDetails & 1);
  bVar1 = this->params->sizePrgRom;
  this->ROMBanks[0] = 0;
  this->ROMBanks[1] = 0x2000;
  uVar2 = (uint)bVar1 * 2;
  this->ROMBanks[2] = 0xfeU % uVar2 << 0xd;
  this->ROMBanks[3] = 0xffU % uVar2 << 0xd;
  this->regs[0] = '\0';
  this->regs[1] = '\0';
  this->regs[2] = '\0';
  this->regs[3] = '\0';
  this->regs[4] = '\0';
  this->regs[5] = '\0';
  this->regs[6] = '\0';
  this->regs[7] = '\0';
  return;
}

Assistant:

Mapper004::Mapper004(struct FileHeader *_header) {
    params = _header;
    Console &c = Console::Instance();
    c.getPPU()->setMirroring(_header->flagsPPUDetails & 1);
    ROMBanks[0] = calcRBankOffset(0);
    ROMBanks[1] = calcRBankOffset(1);
    ROMBanks[2] = calcRBankOffset(-2);
    ROMBanks[3] = calcRBankOffset(-1);
    memset(regs, 0x00, sizeof(regs));
}